

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PluralFormat::format
          (PluralFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  UBool UVar1;
  double number;
  UErrorCode *status_local;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  Formattable *obj_local;
  PluralFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  this_local = (PluralFormat *)appendTo;
  if (UVar1 == '\0') {
    UVar1 = Formattable::isNumeric(obj);
    if (UVar1 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      number = Formattable::getDouble(obj);
      this_local = (PluralFormat *)format(this,obj,number,appendTo,pos,status);
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
PluralFormat::format(const Formattable& obj,
                   UnicodeString& appendTo,
                   FieldPosition& pos,
                   UErrorCode& status) const
{
    if (U_FAILURE(status)) return appendTo;

    if (obj.isNumeric()) {
        return format(obj, obj.getDouble(), appendTo, pos, status);
    } else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
    }
}